

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodetxb.c
# Opt level: O0

void av1_read_coeffs_txb(AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,
                        int col,TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  BLOCK_SIZE BVar3;
  uint8_t uVar4;
  PLANE_TYPE PVar5;
  TX_TYPE TVar6;
  int iVar7;
  int in_ECX;
  int in_EDX;
  MACROBLOCKD *in_RSI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  int idx;
  int idy;
  int stride;
  int tx_unit;
  int txh;
  int txw;
  TX_TYPE tx_type;
  PLANE_TYPE plane_type;
  uint8_t cul_level;
  TXB_CTX txb_ctx;
  BLOCK_SIZE plane_bsize;
  BLOCK_SIZE bsize;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int in_stack_0000062c;
  int in_stack_00000630;
  int in_stack_00000634;
  aom_reader *in_stack_00000638;
  DecoderCodingBlock *in_stack_00000640;
  AV1_COMMON *in_stack_00000648;
  TXB_CTX *in_stack_00000680;
  TX_SIZE in_stack_00000688;
  TXB_CTX *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar8;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar9;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  TX_SIZE tx_size_00;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar10;
  PLANE_TYPE in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  BLOCK_SIZE bsize_00;
  macroblockd_plane *pmVar11;
  macroblockd_plane *pd_00;
  int iVar12;
  
  tx_size_00 = (TX_SIZE)((uint)in_stack_ffffffffffffffa8 >> 0x18);
  pd_00 = (macroblockd_plane *)*in_RSI->mi;
  pmVar11 = in_RSI->plane + in_ECX;
  bsize_00 = pd_00->plane_type;
  BVar3 = get_plane_block_size(bsize_00,pmVar11->subsampling_x,pmVar11->subsampling_y);
  get_txb_ctx((BLOCK_SIZE)((uint)in_stack_ffffffffffffffa4 >> 0x18),
              (TX_SIZE)((uint)in_stack_ffffffffffffffa4 >> 0x10),in_stack_ffffffffffffffa0,
              (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
              (ENTROPY_CONTEXT *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
              in_stack_ffffffffffffff88);
  uVar4 = read_coeffs_txb(in_stack_00000648,in_stack_00000640,in_stack_00000638,in_stack_00000634,
                          in_stack_00000630,in_stack_0000062c,in_stack_00000680,in_stack_00000688);
  uVar10 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffffb0);
  iVar12 = in_R8D;
  av1_set_entropy_contexts
            (in_RSI,pd_00,(int)((ulong)pmVar11 >> 0x20),(BLOCK_SIZE)((ulong)pmVar11 >> 0x18),
             (TX_SIZE)((ulong)pmVar11 >> 0x10),
             CONCAT13(bsize_00,CONCAT12(BVar3,in_stack_ffffffffffffffbc)),in_R8D,in_EDX);
  iVar7 = is_inter_block((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff94,in_R8D));
  if (iVar7 != 0) {
    PVar5 = get_plane_type(in_ECX);
    TVar6 = av1_get_tx_type((MACROBLOCKD *)
                            CONCAT17(bsize_00,CONCAT16(BVar3,CONCAT24(in_stack_ffffffffffffffbc,
                                                                      in_stack_ffffffffffffffb8))),
                            in_stack_ffffffffffffffb7,
                            CONCAT13((char)((uint)uVar10 >> 0x18),CONCAT12(PVar5,(short)uVar10)),
                            in_stack_ffffffffffffffac,tx_size_00,in_stack_ffffffffffffffa4);
    if (in_ECX == 0) {
      iVar7 = tx_size_wide_unit[in_stack_00000008];
      iVar1 = tx_size_high_unit[in_stack_00000008];
      if ((iVar7 == 0x10) || (iVar1 == 0x10)) {
        iVar2 = in_RSI->tx_type_map_stride;
        for (iVar9 = 0; iVar9 < iVar1; iVar9 = iVar9 + 4) {
          for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 4) {
            in_RSI->tx_type_map[(iVar12 + iVar9) * iVar2 + in_R9D + iVar8] = TVar6;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_read_coeffs_txb(const AV1_COMMON *const cm, DecoderCodingBlock *dcb,
                         aom_reader *const r, const int plane, const int row,
                         const int col, const TX_SIZE tx_size) {
#if TXCOEFF_TIMER
  struct aom_usec_timer timer;
  aom_usec_timer_start(&timer);
#endif
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[plane];

  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);

  TXB_CTX txb_ctx;
  get_txb_ctx(plane_bsize, tx_size, plane, pd->above_entropy_context + col,
              pd->left_entropy_context + row, &txb_ctx);
  const uint8_t cul_level =
      read_coeffs_txb(cm, dcb, r, row, col, plane, &txb_ctx, tx_size);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level, col,
                           row);

  if (is_inter_block(mbmi)) {
    const PLANE_TYPE plane_type = get_plane_type(plane);
    // tx_type will be read out in av1_read_coeffs_txb_facade
    const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, row, col, tx_size,
                                            cm->features.reduced_tx_set_used);

    if (plane == 0) {
      const int txw = tx_size_wide_unit[tx_size];
      const int txh = tx_size_high_unit[tx_size];
      // The 16x16 unit is due to the constraint from tx_64x64 which sets the
      // maximum tx size for chroma as 32x32. Coupled with 4x1 transform block
      // size, the constraint takes effect in 32x16 / 16x32 size too. To solve
      // the intricacy, cover all the 16x16 units inside a 64 level transform.
      if (txw == tx_size_wide_unit[TX_64X64] ||
          txh == tx_size_high_unit[TX_64X64]) {
        const int tx_unit = tx_size_wide_unit[TX_16X16];
        const int stride = xd->tx_type_map_stride;
        for (int idy = 0; idy < txh; idy += tx_unit) {
          for (int idx = 0; idx < txw; idx += tx_unit) {
            xd->tx_type_map[(row + idy) * stride + col + idx] = tx_type;
          }
        }
      }
    }
  }

#if TXCOEFF_TIMER
  aom_usec_timer_mark(&timer);
  const int64_t elapsed_time = aom_usec_timer_elapsed(&timer);
  cm->txcoeff_timer += elapsed_time;
  ++cm->txb_count;
#endif
}